

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void attrsEmptyHash(TidyDocImpl *doc,TidyAttribImpl *attribs)

{
  _AttrHash *p_Var1;
  uint local_2c;
  uint i;
  AttrHash *next;
  AttrHash *dict;
  TidyAttribImpl *attribs_local;
  TidyDocImpl *doc_local;
  
  for (local_2c = 0; local_2c < 0xb2; local_2c = local_2c + 1) {
    next = attribs->hashtab[local_2c];
    while (next != (AttrHash *)0x0) {
      p_Var1 = next->next;
      (*doc->allocator->vtbl->free)(doc->allocator,next);
      next = p_Var1;
    }
    attribs->hashtab[local_2c] = (AttrHash *)0x0;
  }
  return;
}

Assistant:

static void attrsEmptyHash( TidyDocImpl* doc, TidyAttribImpl * attribs )
{
    AttrHash *dict, *next;
    uint i;

    for (i = 0; i < ATTRIBUTE_HASH_SIZE; ++i)
    {
        dict = attribs->hashtab[i];

        while(dict)
        {
            next = dict->next;
            TidyDocFree(doc, dict);
            dict = next;
        }

        attribs->hashtab[i] = NULL;
    }
}